

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_ctz(TCGContext_conflict9 *s,int rexw,TCGReg dest,TCGReg arg1,TCGArg arg2,_Bool const_a2
                )

{
  _Bool const_a2_local;
  TCGArg arg2_local;
  TCGReg arg1_local;
  TCGReg dest_local;
  int rexw_local;
  TCGContext_conflict9 *s_local;
  
  if (have_bmi1_tricore) {
    tcg_out_modrm(s,rexw + 0x201bc,dest,arg1);
    if (!const_a2) {
      tcg_out_cmov(s,TCG_COND_LTU,rexw,dest,(TCGReg)arg2);
    }
  }
  else {
    tcg_out_modrm(s,rexw + 0x1bc,dest,arg1);
    tcg_out_cmov(s,TCG_COND_EQ,rexw,dest,(TCGReg)arg2);
  }
  return;
}

Assistant:

static void tcg_out_ctz(TCGContext *s, int rexw, TCGReg dest, TCGReg arg1,
                        TCGArg arg2, bool const_a2)
{
    if (have_bmi1) {
        tcg_out_modrm(s, OPC_TZCNT + rexw, dest, arg1);
        if (const_a2) {
            tcg_debug_assert(arg2 == (rexw ? 64 : 32));
        } else {
            tcg_debug_assert(dest != arg2);
            tcg_out_cmov(s, TCG_COND_LTU, rexw, dest, arg2);
        }
    } else {
        tcg_debug_assert(dest != arg2);
        tcg_out_modrm(s, OPC_BSF + rexw, dest, arg1);
        tcg_out_cmov(s, TCG_COND_EQ, rexw, dest, arg2);
    }
}